

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_DateTimeStruct * UA_DateTime_toStruct(UA_DateTimeStruct *__return_storage_ptr__,UA_DateTime t)

{
  undefined1 auVar1 [16];
  undefined1 auStack_58 [8];
  tm ts;
  
  auVar1 = SEXT816(t % 10000) * SEXT816(0x6666666666666667);
  __return_storage_ptr__->nanoSec =
       ((short)t +
       ((short)(SUB164(SEXT816(t) * SEXT816(0x6666666666666667),8) >> 2) -
       (SUB162(SEXT816(t) * SEXT816(0x6666666666666667),0xe) >> 0xf)) * -10) * 100;
  __return_storage_ptr__->microSec = (short)(auVar1._8_8_ >> 2) - (auVar1._14_2_ >> 0xf);
  auVar1 = SEXT816(t % 10000000) * SEXT816(0x346dc5d63886594b);
  __return_storage_ptr__->milliSec = (short)(auVar1._8_4_ >> 0xb) - (auVar1._14_2_ >> 0xf);
  ts.tm_wday = 0;
  ts.tm_yday = 0;
  ts.tm_isdst = 0;
  ts._36_4_ = 0;
  ts.tm_hour = 0;
  ts.tm_mday = 0;
  ts.tm_mon = 0;
  ts.tm_year = 0;
  auStack_58._0_4_ = 0;
  auStack_58._4_4_ = 0;
  ts.tm_sec = 0;
  ts.tm_min = 0;
  ts.tm_gmtoff = 0;
  __secs_to_tm((t + -0x19db1ded53e8000) / 10000000,(tm *)auStack_58);
  __return_storage_ptr__->sec = auStack_58._0_2_;
  __return_storage_ptr__->min = auStack_58._4_2_;
  __return_storage_ptr__->hour = (UA_UInt16)ts.tm_sec;
  __return_storage_ptr__->day = (UA_UInt16)ts.tm_min;
  __return_storage_ptr__->month = (short)ts.tm_hour + 1;
  __return_storage_ptr__->year = (short)ts.tm_mday + 0x76c;
  return __return_storage_ptr__;
}

Assistant:

UA_DateTimeStruct
UA_DateTime_toStruct(UA_DateTime t) {
    /* Calculating the the milli-, micro- and nanoseconds */
    UA_DateTimeStruct dateTimeStruct;
    dateTimeStruct.nanoSec  = (UA_UInt16)((t % 10) * 100);
    dateTimeStruct.microSec = (UA_UInt16)((t % 10000) / 10);
    dateTimeStruct.milliSec = (UA_UInt16)((t % 10000000) / 10000);

    /* Calculating the unix time with #include <time.h> */
    time_t secSinceUnixEpoch =
        (time_t)((t - UA_DATETIME_UNIX_EPOCH) / UA_SEC_TO_DATETIME);
    struct tm ts;
    memset(&ts, 0, sizeof(struct tm));
    __secs_to_tm(secSinceUnixEpoch, &ts);
    dateTimeStruct.sec    = (UA_UInt16)ts.tm_sec;
    dateTimeStruct.min    = (UA_UInt16)ts.tm_min;
    dateTimeStruct.hour   = (UA_UInt16)ts.tm_hour;
    dateTimeStruct.day    = (UA_UInt16)ts.tm_mday;
    dateTimeStruct.month  = (UA_UInt16)(ts.tm_mon + 1);
    dateTimeStruct.year   = (UA_UInt16)(ts.tm_year + 1900);
    return dateTimeStruct;
}